

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O0

void nrg::InstantExecution::push<TimedCaller>(Queue *queue,TimedCaller *fn)

{
  function<void_()> local_90;
  TimedCaller local_60;
  undefined1 local_38 [8];
  QueueElement elem;
  TimedCaller *fn_local;
  Queue *queue_local;
  
  elem._M_invoker = (_Invoker_type)fn;
  TimedCaller::TimedCaller(&local_60,fn);
  std::function<void()>::
  function<nrg::InstantExecution::push<TimedCaller>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,TimedCaller)::_lambda()_1_,void>
            ((function<void()> *)local_38,(anon_class_40_1_3fcf6586 *)&local_60);
  push<TimedCaller>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,TimedCaller)
  ::{lambda()#1}::~queue((_lambda___1_ *)&local_60);
  std::function<void_()>::function(&local_90,(function<void_()> *)local_38);
  push(queue,&local_90);
  std::function<void_()>::~function(&local_90);
  std::function<void_()>::~function((function<void_()> *)local_38);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }